

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getAnalogies(FastText *this,int32_t k,string *wordA,string *wordB,string *wordC)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ulong uVar1;
  int32_t k_00;
  bool bVar2;
  type __comp;
  string *in_RCX;
  undefined4 in_EDX;
  string *in_RSI;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  string *this_00;
  string *in_R8;
  string *in_R9;
  real rVar3;
  real rVar4;
  real rVar5;
  Vector buffer;
  Vector query;
  unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
  *in_stack_fffffffffffffe60;
  Vector *in_stack_fffffffffffffe70;
  Vector *in_stack_fffffffffffffe80;
  Vector *in_stack_fffffffffffffe88;
  string *psVar6;
  FastText *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar7;
  FastText *in_stack_fffffffffffffee0;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [24];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  string local_b0 [4];
  Vector *pVVar8;
  DenseMatrix *in_stack_ffffffffffffff60;
  FastText *in_stack_ffffffffffffff68;
  Vector local_48;
  string *local_30;
  string *local_28;
  string *local_20;
  undefined4 local_14;
  
  pvVar7 = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1945f5);
  pVVar8 = &local_48;
  Vector::Vector((Vector *)in_stack_fffffffffffffe90,(int64_t)in_stack_fffffffffffffe88);
  Vector::zero(in_stack_fffffffffffffe70);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x19462a);
  Vector::Vector((Vector *)in_stack_fffffffffffffe90,(int64_t)in_stack_fffffffffffffe88);
  getWordVector(in_stack_fffffffffffffee0,pVVar8,in_RSI,(int)((ulong)pvVar7 >> 0x20),SUB84(pvVar7,0)
               );
  rVar3 = Vector::norm(in_stack_fffffffffffffe80);
  Vector::addVector((Vector *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                    (real)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  getWordVector(in_stack_fffffffffffffee0,pVVar8,in_RSI,(int)((ulong)pvVar7 >> 0x20),SUB84(pvVar7,0)
               );
  rVar4 = Vector::norm(in_stack_fffffffffffffe80);
  Vector::addVector((Vector *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                    (real)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  getWordVector(in_stack_fffffffffffffee0,pVVar8,in_RSI,(int)((ulong)pvVar7 >> 0x20),SUB84(pvVar7,0)
               );
  rVar5 = Vector::norm(in_stack_fffffffffffffe80);
  Vector::addVector((Vector *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                    (real)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  lazyComputeWordVectors(in_stack_fffffffffffffe90);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                      *)0x1947b6);
  if (!bVar2) {
    __assert_fail("wordVectors_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/fasttext.cc"
                  ,0x2b6,
                  "std::vector<std::pair<real, std::string>> fasttext::FastText::getAnalogies(int32_t, const std::string &, const std::string &, const std::string &)"
                 );
  }
  __comp = std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::
           operator*(in_stack_fffffffffffffe60);
  std::__cxx11::string::string(local_110,local_20);
  std::__cxx11::string::string(local_f0,local_28);
  std::__cxx11::string::string(local_d0,local_30);
  _local_b0 = local_110;
  pVVar8 = (Vector *)0x3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1948ba);
  __l._M_array._4_4_ = rVar3;
  __l._M_array._0_4_ = rVar4;
  __l._M_len = (size_type)in_RDI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(rVar5,in_stack_fffffffffffffeb0),__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        __comp,(allocator_type *)CONCAT44(local_14,in_stack_fffffffffffffea0));
  psVar6 = _local_b0;
  uVar1 = (ulong)_local_b0 >> 0x20;
  k_00 = (int32_t)uVar1;
  _local_b0 = psVar6;
  getNN(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,pVVar8,k_00,in_stack_ffffffffffffff48);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x19491e);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x19492b);
  psVar6 = local_110;
  this_00 = local_b0;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar6);
  Vector::~Vector((Vector *)0x194975);
  Vector::~Vector((Vector *)0x194982);
  return pvVar7;
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getAnalogies(
    int32_t k,
    const std::string& wordA,
    const std::string& wordB,
    const std::string& wordC) {
  Vector query = Vector(args_->dim);
  query.zero();

  Vector buffer(args_->dim);
  getWordVector(buffer, wordA);
  query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));
  getWordVector(buffer, wordB);
  query.addVector(buffer, -1.0 / (buffer.norm() + 1e-8));
  getWordVector(buffer, wordC);
  query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));

  lazyComputeWordVectors();
  assert(wordVectors_);
  return getNN(*wordVectors_, query, k, {wordA, wordB, wordC});
}